

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureTest::init
          (TextureTest *this,EVP_PKEY_CTX *ctx)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  ContextInfo *ctxInfo;
  RequiredExtensions extensions;
  RequiredExtensions local_48;
  ContextType local_2c;
  RequiredExtensions local_28;
  
  ctxInfo = glu::ContextInfo::create(this->m_renderCtx);
  local_28.m_extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.m_extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.m_extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.m_extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = (*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = isCoreTextureTarget((ContextType *)&local_48,this->m_target);
  if (!bVar2) {
    local_2c.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    getTextureTargetExtension(&local_48,&local_2c,this->m_target);
    RequiredExtensions::add(&local_28,&local_48);
    pvVar1 = (void *)CONCAT44(local_48.m_extensions.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_48.m_extensions.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_48.m_extensions.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1)
      ;
    }
  }
  local_48.m_extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = (*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = isCoreTextureParam((ContextType *)&local_48,this->m_pname);
  if (!bVar2) {
    local_2c.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    getTextureParamExtension(&local_48,&local_2c,this->m_pname);
    RequiredExtensions::add(&local_28,&local_48);
    pvVar1 = (void *)CONCAT44(local_48.m_extensions.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_48.m_extensions.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_48.m_extensions.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1)
      ;
    }
  }
  local_48.m_extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = (*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = isCoreQuery((ContextType *)&local_48,this->m_type);
  if (!bVar2) {
    local_2c.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    getQueryExtension(&local_48,&local_2c,this->m_type);
    RequiredExtensions::add(&local_28,&local_48);
    pvVar1 = (void *)CONCAT44(local_48.m_extensions.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_48.m_extensions.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_48.m_extensions.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1)
      ;
    }
  }
  local_48.m_extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = (*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = isCoreTester((ContextType *)&local_48,this->m_tester);
  if (!bVar2) {
    local_2c.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    getTesterExtension(&local_48,&local_2c,this->m_tester);
    RequiredExtensions::add(&local_28,&local_48);
    pvVar1 = (void *)CONCAT44(local_48.m_extensions.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_48.m_extensions.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_48.m_extensions.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1)
      ;
    }
  }
  RequiredExtensions::check(&local_28,ctxInfo);
  if (local_28.m_extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.m_extensions.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.m_extensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.m_extensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar3 = (*ctxInfo->_vptr_ContextInfo[1])(ctxInfo);
  return iVar3;
}

Assistant:

void TextureTest::init (void)
{
	const de::UniquePtr<glu::ContextInfo>	ctxInfo		(glu::ContextInfo::create(m_renderCtx));
	RequiredExtensions						extensions;

	// target
	if (!isCoreTextureTarget(m_renderCtx.getType(), m_target))
		extensions.add(getTextureTargetExtension(m_renderCtx.getType(), m_target));

	// param
	if (!isCoreTextureParam(m_renderCtx.getType(), m_pname))
		extensions.add(getTextureParamExtension(m_renderCtx.getType(), m_pname));

	// query
	if (!isCoreQuery(m_renderCtx.getType(), m_type))
		extensions.add(getQueryExtension(m_renderCtx.getType(), m_type));

	// test type
	if (!isCoreTester(m_renderCtx.getType(), m_tester))
		extensions.add(getTesterExtension(m_renderCtx.getType(), m_tester));

	extensions.check(*ctxInfo);
}